

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memvar_propagation.hpp
# Opt level: O0

string * __thiscall
optimization::memvar_propagation::Memory_Var_Propagation::pass_name_abi_cxx11_
          (Memory_Var_Propagation *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 8));
  return in_RDI;
}

Assistant:

std::string pass_name() const { return name; }